

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::simplify(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,Real remainingTime,bool keepbounds,uint32_t seed)

{
  DataArray<int> *this_00;
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pnVar4;
  Tolerances *pTVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int *piVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  Result RVar11;
  double *pdVar12;
  SPxOut *pSVar13;
  undefined7 in_register_00000011;
  long lVar14;
  long lVar15;
  Real RVar16;
  bool again;
  Verbosity old_verbosity;
  Verbosity old_verbosity_1;
  bool local_1dd;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  Verbosity local_1cc;
  cpp_dec_float<50U,_int,_void> local_1c8;
  cpp_dec_float<50U,_int,_void> local_188;
  undefined1 local_148 [16];
  double local_138;
  undefined8 uStack_130;
  undefined1 local_128 [32];
  uint local_108 [2];
  int local_100;
  bool local_fc;
  undefined8 local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).spxout = lp->spxout;
  this->m_thesense = lp->thesense;
  (*((this->
     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ).m_timeUsed)->_vptr_Timer[2])(remainingTime);
  (*((this->
     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ).m_timeUsed)->_vptr_Timer[3])();
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_objoffset,0.0);
  ::soplex::infinity::__tls_init();
  pdVar12 = (double *)__tls_get_addr(&PTR_003b4b70);
  local_138 = *pdVar12;
  uStack_130 = 0;
  local_148._0_8_ = -local_138;
  local_148._8_4_ = 0;
  local_148._12_4_ = 0x80000000;
  local_1c8.fpclass = cpp_dec_float_finite;
  local_1c8.prec_elem = 10;
  local_1c8.data._M_elems._0_16_ = ZEXT416(0);
  local_1c8.data._M_elems[4] = 0;
  local_1c8.data._M_elems[5] = 0;
  local_1c8.data._M_elems._24_5_ = 0;
  local_1c8.data._M_elems[7]._1_3_ = 0;
  local_1c8.data._M_elems._32_5_ = 0;
  local_1c8.data._M_elems[9]._1_3_ = 0;
  local_1c8.exp = 0;
  local_1c8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1c8,(double)local_148._0_8_);
  *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems = local_1c8.data._M_elems._0_8_;
  *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) = local_1c8.data._M_elems._8_8_
  ;
  *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
       local_1c8.data._M_elems._16_8_;
  *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
       CONCAT35(local_1c8.data._M_elems[7]._1_3_,local_1c8.data._M_elems._24_5_);
  *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
       CONCAT35(local_1c8.data._M_elems[9]._1_3_,local_1c8.data._M_elems._32_5_);
  (this->m_cutoffbound).m_backend.exp = local_1c8.exp;
  (this->m_cutoffbound).m_backend.neg = local_1c8.neg;
  (this->m_cutoffbound).m_backend.fpclass = local_1c8.fpclass;
  (this->m_cutoffbound).m_backend.prec_elem = local_1c8.prec_elem;
  ::soplex::infinity::__tls_init();
  local_1c8.fpclass = cpp_dec_float_finite;
  local_1c8.prec_elem = 10;
  local_1c8.data._M_elems._0_16_ = ZEXT816(0);
  local_1c8.data._M_elems[4] = 0;
  local_1c8.data._M_elems[5] = 0;
  local_1c8.data._M_elems._24_5_ = 0;
  local_1c8.data._M_elems[7]._1_3_ = 0;
  local_1c8.data._M_elems._32_5_ = 0;
  local_1c8.data._M_elems[9]._1_3_ = 0;
  local_1c8.exp = 0;
  local_1c8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1c8,(double)local_148._0_8_);
  *(undefined8 *)(this->m_pseudoobj).m_backend.data._M_elems = local_1c8.data._M_elems._0_8_;
  *(undefined8 *)((this->m_pseudoobj).m_backend.data._M_elems + 2) = local_1c8.data._M_elems._8_8_;
  *(undefined8 *)((this->m_pseudoobj).m_backend.data._M_elems + 4) = local_1c8.data._M_elems._16_8_;
  *(ulong *)((this->m_pseudoobj).m_backend.data._M_elems + 6) =
       CONCAT35(local_1c8.data._M_elems[7]._1_3_,local_1c8.data._M_elems._24_5_);
  *(ulong *)((this->m_pseudoobj).m_backend.data._M_elems + 8) =
       CONCAT35(local_1c8.data._M_elems[9]._1_3_,local_1c8.data._M_elems._32_5_);
  (this->m_pseudoobj).m_backend.exp = local_1c8.exp;
  (this->m_pseudoobj).m_backend.neg = local_1c8.neg;
  (this->m_pseudoobj).m_backend.fpclass = local_1c8.fpclass;
  (this->m_pseudoobj).m_backend.prec_elem = local_1c8.prec_elem;
  this->m_result = OKAY;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remRows = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remNzos = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_chgBnds = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_chgBnds = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_chgLRhs = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_keptBnds = 0;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_keptLRhs = 0;
  local_1dd = true;
  if (0 < (int)((ulong)((long)(this->m_hist).data.
                              super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_hist).data.
                             super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    std::
    vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
    ::clear(&(this->m_hist).data);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::resize(&(this->m_hist).data,0);
  this->m_postsolved = false;
  pSVar13 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  local_1d8 = (int)CONCAT71(in_register_00000011,keepbounds);
  if ((pSVar13 != (SPxOut *)0x0) && (3 < (int)pSVar13->m_verbosity)) {
    local_1c8.data._M_elems[0] = 4;
    local_1cc = pSVar13->m_verbosity;
    (*pSVar13->_vptr_SPxOut[2])();
    local_1d4 = 0;
    local_1dc = 0;
    local_1d0 = 0;
    if (0 < (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      lVar15 = 0;
      lVar14 = 0;
      local_1d0 = 0;
      local_1dc = 0;
      do {
        pnVar4 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_1c8.fpclass = cpp_dec_float_finite;
        local_1c8.prec_elem = 10;
        local_1c8.data._M_elems._0_16_ = ZEXT816(0);
        local_1c8.data._M_elems[4] = 0;
        local_1c8.data._M_elems[5] = 0;
        local_1c8.data._M_elems._24_5_ = 0;
        local_1c8.data._M_elems[7]._1_3_ = 0;
        local_1c8.data._M_elems._32_5_ = 0;
        local_1c8.data._M_elems[9]._1_3_ = 0;
        local_1c8.exp = 0;
        local_1c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1c8,(double)local_148._0_8_);
        if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
            (local_1c8.fpclass != cpp_dec_float_NaN)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_1c8),
           0 < iVar10)) {
          pnVar4 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_188.fpclass = cpp_dec_float_finite;
          local_188.prec_elem = 10;
          local_188.data._M_elems._0_16_ = ZEXT816(0);
          local_188.data._M_elems[4] = 0;
          local_188.data._M_elems[5] = 0;
          local_188.data._M_elems._24_5_ = 0;
          local_188.data._M_elems[7]._1_3_ = 0;
          local_188.data._M_elems._32_5_ = 0;
          local_188._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_188,local_138);
          if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
              (local_188.fpclass != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_188),
             iVar10 < 0)) {
            pnVar4 = (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_68.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar15 + 0x20);
            puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar15);
            local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar15 + 0x10);
            local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_68.m_backend.exp = *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15);
            local_68.m_backend.neg = *(bool *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 4U);
            local_68.m_backend._48_8_ =
                 *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U);
            pnVar4 = (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_a8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar15 + 0x20);
            puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar15);
            local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar15 + 0x10);
            local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_a8.m_backend.exp = *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15);
            local_a8.m_backend.neg = *(bool *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 4U);
            local_a8.m_backend._48_8_ =
                 *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U);
            pTVar5 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var6 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              }
            }
            RVar16 = Tolerances::epsilon(pTVar5);
            bVar9 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (&local_68,&local_a8,RVar16);
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
            }
            if (bVar9) {
              local_1d0 = local_1d0 + 1;
            }
            else {
              local_1dc = local_1dc + 1;
            }
          }
        }
        lVar14 = lVar14 + 1;
        lVar15 = lVar15 + 0x38;
      } while (lVar14 < (lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    if (0 < (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      lVar15 = 0;
      lVar14 = 0;
      local_1d4 = 0;
      do {
        pnVar4 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_1c8.fpclass = cpp_dec_float_finite;
        local_1c8.prec_elem = 10;
        local_1c8.data._M_elems._0_16_ = ZEXT816(0);
        local_1c8.data._M_elems[4] = 0;
        local_1c8.data._M_elems[5] = 0;
        local_1c8.data._M_elems._24_5_ = 0;
        local_1c8.data._M_elems[7]._1_3_ = 0;
        local_1c8.data._M_elems._32_5_ = 0;
        local_1c8.data._M_elems[9]._1_3_ = 0;
        local_1c8.exp = 0;
        local_1c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1c8,(double)local_148._0_8_);
        if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
            (local_1c8.fpclass != cpp_dec_float_NaN)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_1c8),
           0 < iVar10)) {
          pnVar4 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_188.fpclass = cpp_dec_float_finite;
          local_188.prec_elem = 10;
          local_188.data._M_elems._0_16_ = ZEXT816(0);
          local_188.data._M_elems[4] = 0;
          local_188.data._M_elems[5] = 0;
          local_188.data._M_elems._24_5_ = 0;
          local_188.data._M_elems[7]._1_3_ = 0;
          local_188.data._M_elems._32_5_ = 0;
          local_188._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_188,local_138);
          if ((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
             (local_188.fpclass != cpp_dec_float_NaN)) {
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_188);
            local_1d4 = local_1d4 - (iVar10 >> 0x1f);
          }
        }
        lVar14 = lVar14 + 1;
        lVar15 = lVar15 + 0x38;
      } while (lVar14 < (lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    pSVar13 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity],"LP has ",7);
    std::ostream::operator<<((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," equations, ",0xc);
    std::ostream::operator<<((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],local_1dc);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," ranged rows, ",0xe);
    std::ostream::operator<<((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],local_1d4);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," boxed columns",0xe);
    cVar8 = (char)pSVar13->m_streams[pSVar13->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar13->m_streams[pSVar13->m_verbosity] + -0x18)
                    + cVar8);
    std::ostream::put(cVar8);
    std::ostream::flush();
    pSVar13 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_1cc);
    keepbounds = SUB41(local_1d8,0);
  }
  this_00 = &this->m_stat;
  if ((this->m_stat).themax < 0x11) {
    DataArray<int>::reMax(this_00,(int)((this->m_stat).memFactor * 17.0),0x11);
    if (0 < (this->m_stat).thesize) goto LAB_002f4b82;
  }
  else {
    this_00->thesize = 0x11;
LAB_002f4b82:
    piVar7 = (this->m_stat).data;
    lVar14 = 0;
    do {
      piVar7[lVar14] = 0;
      lVar14 = lVar14 + 1;
    } while (lVar14 < this_00->thesize);
  }
  this->m_addedcols = 0;
  handleRowObjectives(this,lp);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->m_prim,
          (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->m_slack,
          (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->m_dual,
          (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->m_redCost,
          (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize(&this->m_cBasisStat,
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::reSize(&this->m_rBasisStat,
           (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum);
  DataArray<int>::reSize
            (&this->m_cIdx,
             (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  DataArray<int>::reSize
            (&this->m_rIdx,
             (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  std::
  vector<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  ::resize(&(this->m_classSetRows).data,
           (long)(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  std::
  vector<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  ::resize(&(this->m_classSetCols).data,
           (long)(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  std::
  vector<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  ::resize(&(this->m_dupRows).data,
           (long)(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  std::
  vector<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  ::resize(&(this->m_dupCols).data,
           (long)(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  this->m_keepbounds = keepbounds;
  if (0 < (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    piVar7 = (this->m_rIdx).data;
    lVar14 = 0;
    do {
      piVar7[lVar14] = (int)lVar14;
      lVar14 = lVar14 + 1;
    } while (lVar14 < (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (0 < (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    piVar7 = (this->m_cIdx).data;
    lVar14 = 0;
    do {
      piVar7[lVar14] = (int)lVar14;
      lVar14 = lVar14 + 1;
    } while (lVar14 < (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  handleExtremes(this,lp);
  bVar9 = this->m_result == OKAY;
  if ((local_1dd & bVar9) == 1) {
    iVar10 = 1;
    do {
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if ((pSVar13 == (SPxOut *)0x0) || ((int)pSVar13->m_verbosity < 5)) {
LAB_002f4df9:
        local_1dd = false;
        RVar11 = simplifyRows(this,lp,&local_1dd);
        this->m_result = RVar11;
        if (RVar11 == OKAY) {
          RVar11 = simplifyCols(this,lp,&local_1dd);
          this->m_result = RVar11;
        }
      }
      else {
        local_1c8.data._M_elems[0] = pSVar13->m_verbosity;
        local_188.data._M_elems[0] = 5;
        (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_188);
        pSVar13 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar13->m_streams[pSVar13->m_verbosity],"Round ",6);
        std::ostream::operator<<((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],iVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar13->m_streams[pSVar13->m_verbosity],":",1);
        cVar8 = (char)pSVar13->m_streams[pSVar13->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar13->m_streams[pSVar13->m_verbosity] + -0x18) + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
        pSVar13 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_1c8);
        RVar11 = this->m_result;
        local_1dd = false;
        if (RVar11 == OKAY) goto LAB_002f4df9;
      }
      if (local_1dd == false) {
        if (RVar11 == OKAY) {
          RVar11 = simplifyDual(this,lp,&local_1dd);
          this->m_result = RVar11;
        }
        if ((local_1dd & 1U) == 0) {
          if (RVar11 == OKAY) {
            RVar11 = duplicateRows(this,lp,&local_1dd);
            this->m_result = RVar11;
            if (RVar11 == OKAY) {
              RVar11 = duplicateCols(this,lp,&local_1dd);
              this->m_result = RVar11;
            }
          }
          if (local_1dd == false) {
            trivialHeuristic(this,lp);
            propagatePseudoobj(this,lp);
            if (this->m_result != OKAY) goto LAB_002f52b2;
            RVar11 = multiaggregation(this,lp,&local_1dd);
            this->m_result = RVar11;
          }
        }
      }
      bVar9 = RVar11 == OKAY;
    } while ((bVar9) && (iVar10 = iVar10 + 1, local_1dd != false));
  }
  if (!bVar9) {
LAB_002f52b2:
    pSVar13 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar13 != (SPxOut *)0x0) && (2 < (int)pSVar13->m_verbosity)) {
      local_1c8.data._M_elems[0] = pSVar13->m_verbosity;
      local_188.data._M_elems[0] = 3;
      (*pSVar13->_vptr_SPxOut[2])();
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity],"Simplifier result: ",0x13);
      std::ostream::operator<<((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],this->m_result);
      cVar8 = (char)pSVar13->m_streams[pSVar13->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar13->m_streams[pSVar13->m_verbosity] + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_1c8);
    }
    goto LAB_002f5d68;
  }
  iVar10 = this->m_addedcols;
  uVar2 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remCols;
  uVar3 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remNzos;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = uVar2 - iVar10;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remNzos = uVar3 - iVar10;
  pSVar13 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if (pSVar13 == (SPxOut *)0x0) {
LAB_002f5895:
    pSVar13 = (SPxOut *)0x0;
  }
  else {
    if (2 < (int)pSVar13->m_verbosity) {
      local_1c8.data._M_elems[0] = pSVar13->m_verbosity;
      local_188.data._M_elems[0] = 3;
      (*pSVar13->_vptr_SPxOut[2])();
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity],"Simplifier removed ",0x13);
      std::ostream::operator<<
                ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_remRows);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," rows, ",7);
      std::ostream::operator<<
                ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_remCols);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," columns, ",10);
      std::ostream::operator<<
                ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_remNzos);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," nonzeros, ",0xb);
      std::ostream::operator<<
                ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_chgBnds);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," col bounds, ",0xd);
      std::ostream::operator<<
                ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_chgLRhs);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," row bounds",0xb);
      cVar8 = (char)pSVar13->m_streams[pSVar13->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar13->m_streams[pSVar13->m_verbosity] + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_1c8);
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
    }
    if ((char)local_1d8 != '\0') {
      if (pSVar13 != (SPxOut *)0x0) {
        if (3 < (int)pSVar13->m_verbosity) {
          local_1c8.data._M_elems[0] = pSVar13->m_verbosity;
          local_188.data._M_elems[0] = 4;
          (*pSVar13->_vptr_SPxOut[2])();
          pSVar13 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar13->m_streams[pSVar13->m_verbosity],"Simplifier kept ",0x10);
          std::ostream::operator<<
                    ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],
                     (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_keptBnds);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar13->m_streams[pSVar13->m_verbosity]," column bounds, ",0x10);
          std::ostream::operator<<
                    ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],
                     (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_keptLRhs);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar13->m_streams[pSVar13->m_verbosity]," row bounds",0xb);
          cVar8 = (char)pSVar13->m_streams[pSVar13->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar13->m_streams[pSVar13->m_verbosity] + -0x18) + cVar8
                         );
          std::ostream::put(cVar8);
          std::ostream::flush();
          pSVar13 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_1c8);
          pSVar13 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          goto LAB_002f51c0;
        }
        goto LAB_002f51c9;
      }
      goto LAB_002f5895;
    }
LAB_002f51c0:
    if (pSVar13 == (SPxOut *)0x0) goto LAB_002f5895;
LAB_002f51c9:
    if (2 < (int)pSVar13->m_verbosity) {
      local_1c8.data._M_elems[0] = pSVar13->m_verbosity;
      local_188.data._M_elems[0] = 3;
      (*pSVar13->_vptr_SPxOut[2])();
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity],"Reduced LP has ",0xf);
      std::ostream::operator<<
                ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],
                 (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," rows ",6);
      std::ostream::operator<<
                ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],
                 (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," columns ",9);
      lVar14 = (long)(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
      if (lVar14 < 1) {
        iVar10 = 0;
      }
      else {
        lVar15 = 0;
        iVar10 = 0;
        do {
          iVar10 = iVar10 + (lp->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.theitem
                            [(lp->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thekey[lVar15].idx].data.
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
          lVar15 = lVar15 + 1;
        } while (lVar14 != lVar15);
      }
      std::ostream::operator<<((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],iVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," nonzeros",9);
      cVar8 = (char)pSVar13->m_streams[pSVar13->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar13->m_streams[pSVar13->m_verbosity] + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_1c8);
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if (pSVar13 == (SPxOut *)0x0) goto LAB_002f5895;
    }
    if (3 < (int)pSVar13->m_verbosity) {
      local_1c8.data._M_elems[0] = 4;
      local_1cc = pSVar13->m_verbosity;
      (*pSVar13->_vptr_SPxOut[2])();
      local_1d4 = 0;
      local_1d8 = 0;
      local_1dc = 0;
      if (0 < (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar15 = 0;
        lVar14 = 0;
        local_1dc = 0;
        local_1d8 = 0;
        do {
          pnVar4 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_1c8.fpclass = cpp_dec_float_finite;
          local_1c8.prec_elem = 10;
          local_1c8.data._M_elems[0] = 0;
          local_1c8.data._M_elems[1] = 0;
          local_1c8.data._M_elems[2] = 0;
          local_1c8.data._M_elems[3] = 0;
          local_1c8.data._M_elems[4] = 0;
          local_1c8.data._M_elems[5] = 0;
          local_1c8.data._M_elems._24_5_ = 0;
          local_1c8.data._M_elems[7]._1_3_ = 0;
          local_1c8.data._M_elems._32_5_ = 0;
          local_1c8.data._M_elems[9]._1_3_ = 0;
          local_1c8.exp = 0;
          local_1c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1c8,(double)local_148._0_8_);
          if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
              (local_1c8.fpclass != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_1c8),
             0 < iVar10)) {
            pnVar4 = (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_188.fpclass = cpp_dec_float_finite;
            local_188.prec_elem = 10;
            local_188.data._M_elems._0_16_ = ZEXT816(0);
            local_188.data._M_elems[4] = 0;
            local_188.data._M_elems[5] = 0;
            local_188.data._M_elems._24_5_ = 0;
            local_188.data._M_elems[7]._1_3_ = 0;
            local_188.data._M_elems._32_5_ = 0;
            local_188._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_188,local_138);
            if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U) != 2) &&
                (local_188.fpclass != cpp_dec_float_NaN)) &&
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)
                                    ((long)(pnVar4->m_backend).data._M_elems + lVar15),&local_188),
               iVar10 < 0)) {
              pnVar4 = (lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_e8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar15 + 0x20);
              puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar15);
              local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
              local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar15 + 0x10);
              local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              local_e8.m_backend.exp = *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15);
              local_e8.m_backend.neg =
                   *(bool *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 4U);
              local_e8.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U);
              pnVar4 = (lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_108 = *(uint (*) [2])((long)(pnVar4->m_backend).data._M_elems + lVar15 + 0x20);
              puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar15);
              local_128._0_8_ = *(undefined8 *)puVar1;
              local_128._8_8_ = *(undefined8 *)(puVar1 + 2);
              local_128._16_16_ =
                   *(undefined1 (*) [16])((long)(pnVar4->m_backend).data._M_elems + lVar15 + 0x10);
              local_100 = *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar15);
              local_fc = *(bool *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 4U);
              local_f8 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + lVar15 + 8U);
              pTVar5 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var6 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                }
              }
              RVar16 = Tolerances::epsilon(pTVar5);
              bVar9 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                (&local_e8,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_128,RVar16);
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
              if (bVar9) {
                local_1dc = local_1dc + 1;
              }
              else {
                local_1d8 = local_1d8 + 1;
              }
            }
          }
          lVar14 = lVar14 + 1;
          lVar15 = lVar15 + 0x38;
        } while (lVar14 < (lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      if (0 < (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar14 = 0;
        lVar15 = 0;
        local_1d4 = 0;
        do {
          pnVar4 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_1c8.fpclass = cpp_dec_float_finite;
          local_1c8.prec_elem = 10;
          local_1c8.data._M_elems[0] = 0;
          local_1c8.data._M_elems[1] = 0;
          local_1c8.data._M_elems[2] = 0;
          local_1c8.data._M_elems[3] = 0;
          local_1c8.data._M_elems[4] = 0;
          local_1c8.data._M_elems[5] = 0;
          local_1c8.data._M_elems._24_5_ = 0;
          local_1c8.data._M_elems[7]._1_3_ = 0;
          local_1c8.data._M_elems._32_5_ = 0;
          local_1c8.data._M_elems[9]._1_3_ = 0;
          local_1c8.exp = 0;
          local_1c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1c8,(double)local_148._0_8_);
          if (((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar14 + 8U) != 2) &&
              (local_1c8.fpclass != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar4->m_backend).data._M_elems + lVar14),&local_1c8),
             0 < iVar10)) {
            pnVar4 = (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_188.fpclass = cpp_dec_float_finite;
            local_188.prec_elem = 10;
            local_188.data._M_elems[0] = 0;
            local_188.data._M_elems[1] = 0;
            local_188.data._M_elems[2] = 0;
            local_188.data._M_elems[3] = 0;
            local_188.data._M_elems[4] = 0;
            local_188.data._M_elems[5] = 0;
            local_188.data._M_elems._24_5_ = 0;
            local_188.data._M_elems[7]._1_3_ = 0;
            local_188.data._M_elems._32_5_ = 0;
            local_188._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_188,local_138);
            if ((*(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar14 + 8U) != 2) &&
               (local_188.fpclass != cpp_dec_float_NaN)) {
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar4->m_backend).data._M_elems + lVar14),&local_188);
              local_1d4 = local_1d4 - (iVar10 >> 0x1f);
            }
          }
          lVar15 = lVar15 + 1;
          lVar14 = lVar14 + 0x38;
        } while (lVar15 < (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity],"Reduced LP has ",0xf);
      std::ostream::operator<<((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],local_1dc);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," equations, ",0xc);
      std::ostream::operator<<((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," ranged rows, ",0xe);
      std::ostream::operator<<((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],local_1d4);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar13->m_streams[pSVar13->m_verbosity]," boxed columns",0xe);
      cVar8 = (char)pSVar13->m_streams[pSVar13->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar13->m_streams[pSVar13->m_verbosity] + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_1cc);
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
    }
  }
  if ((lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum == 0 &&
      (lp->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum == 0) {
    if (pSVar13 == (SPxOut *)0x0) {
      pSVar13 = (SPxOut *)0x0;
    }
    else if (2 < (int)pSVar13->m_verbosity) {
      local_1c8.data._M_elems[0] = pSVar13->m_verbosity;
      local_188.data._M_elems[0] = 3;
      (*pSVar13->_vptr_SPxOut[2])();
      pSVar13 = operator<<((this->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).spxout,"Simplifier removed all rows and columns");
      std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_1c8);
      pSVar13 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
    }
    this->m_result = VANISHED;
  }
  if ((pSVar13 != (SPxOut *)0x0) && (3 < (int)pSVar13->m_verbosity)) {
    local_1c8.data._M_elems[0] = pSVar13->m_verbosity;
    local_188.data._M_elems[0] = 4;
    (*pSVar13->_vptr_SPxOut[2])();
    pSVar13 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity],"\nSimplifier performed:\n",0x17);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],*(this->m_stat).data);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," empty rows\n",0xc);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," free rows\n",0xb);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[2]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," singleton rows\n",0x10);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[3]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," forcing rows\n",0xe);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[4]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," empty columns\n",0xf);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[5]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," fixed columns\n",0xf);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[6]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," free columns with zero objective\n",0x22);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[7]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," singleton columns with zero objective\n",
               0x27);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[8]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity],
               " singleton columns combined with a doubleton equation\n",0x36);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[9]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," free singleton columns\n",0x18);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[10]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," dominated columns\n",0x13);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[0xb]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," weakly dominated columns\n",0x1a);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[0xc]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," duplicate rows\n",0x10);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[0xd]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," duplicate columns (fixed)\n",0x1b);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[0xe]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," duplicate columns (substituted)\n",0x21);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[0xf]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," variable aggregations\n",0x17);
    std::ostream::operator<<
              ((ostream *)pSVar13->m_streams[pSVar13->m_verbosity],(this->m_stat).data[0x10]);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar13->m_streams[pSVar13->m_verbosity]," multi aggregations\n",0x14);
    cVar8 = (char)pSVar13->m_streams[pSVar13->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar13->m_streams[pSVar13->m_verbosity] + -0x18)
                    + cVar8);
    std::ostream::put(cVar8);
    std::ostream::flush();
    pSVar13 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    (*pSVar13->_vptr_SPxOut[2])(pSVar13,&local_1c8);
  }
  (*((this->
     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ).m_timeUsed)->_vptr_Timer[4])();
LAB_002f5d68:
  return this->m_result;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplify(SPxLPBase<R>& lp, Real remainingTime,
      bool keepbounds, uint32_t seed)
{
   // transfer message handler
   this->spxout = lp.spxout;
   assert(this->spxout != nullptr);

   m_thesense = lp.spxSense();
   this->m_timeUsed->reset();
   this->m_timeUsed->start();

   this->m_objoffset = 0.0;
   m_cutoffbound = R(-infinity);
   m_pseudoobj = R(-infinity);

   this->m_remRows = 0;
   this->m_remCols = 0;
   this->m_remNzos = 0;
   this->m_chgBnds = 0;
   this->m_chgLRhs = 0;
   this->m_keptBnds = 0;
   this->m_keptLRhs = 0;

   m_result     = this->OKAY;
   bool   again = true;
   int nrounds = 0;

   if(m_hist.size() > 0)
   {
      m_hist.clear();
   }

   m_hist.reSize(0);
   m_postsolved = false;

   SPX_MSG_INFO2((*this->spxout),
                 int numRangedRows = 0;
                 int numBoxedCols = 0;
                 int numEqualities = 0;

                 for(int i = 0; i < lp.nRows(); ++i)
{
   if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
      {
         if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
            ++numEqualities;
         else
            ++numRangedRows;
      }
   }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         m_stat.reSize(17);

   for(int k = 0; k < m_stat.size(); ++k)
      m_stat[k] = 0;

   m_addedcols = 0;
   handleRowObjectives(lp);

   m_prim.reDim(lp.nCols());
   m_slack.reDim(lp.nRows());
   m_dual.reDim(lp.nRows());
   m_redCost.reDim(lp.nCols());
   m_cBasisStat.reSize(lp.nCols());
   m_rBasisStat.reSize(lp.nRows());
   m_cIdx.reSize(lp.nCols());
   m_rIdx.reSize(lp.nRows());

   m_classSetRows.reSize(lp.nRows());
   m_classSetCols.reSize(lp.nCols());
   m_dupRows.reSize(lp.nRows());
   m_dupCols.reSize(lp.nCols());

   m_keepbounds = keepbounds;

   for(int i = 0; i < lp.nRows(); ++i)
      m_rIdx[i] = i;

   for(int j = 0; j < lp.nCols(); ++j)
      m_cIdx[j] = j;

   // round extreme values (set all values smaller than this->eps to zero and all values bigger than R(infinity)/5 to R(infinity))
#if SOPLEX_EXTREMES
   handleExtremes(lp);
#endif

   // main presolving loop
   while(again && m_result == this->OKAY)
   {
      nrounds++;
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Round " << nrounds << ":" << std::endl;)
      again = false;

#if SOPLEX_ROWS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyRows(lp, again);

#endif

#if SOPLEX_COLS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyCols(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUAL_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyDual(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUPLICATE_ROWS

      if(m_result == this->OKAY)
         m_result = duplicateRows(lp, again);

#endif

#if SOPLEX_DUPLICATE_COLS

      if(m_result == this->OKAY)
         m_result = duplicateCols(lp, again);

#endif

      if(!again)
      {
#if SOPLEX_TRIVIAL_HEURISTICS
         trivialHeuristic(lp);
#endif

#if SOPLEX_PSEUDOOBJ
         propagatePseudoobj(lp);
#endif

#if SOPLEX_MULTI_AGGREGATE

         if(m_result == this->OKAY)
            m_result = multiaggregation(lp, again);

#endif
      }

   }

   // preprocessing detected infeasibility or unboundedness
   if(m_result != this->OKAY)
   {
      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier result: " << static_cast<int>
                    (m_result) << std::endl;)
      return m_result;
   }

   this->m_remCols -= m_addedcols;
   this->m_remNzos -= m_addedcols;
   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed "
                 << this->m_remRows << " rows, "
                 << this->m_remCols << " columns, "
                 << this->m_remNzos << " nonzeros, "
                 << this->m_chgBnds << " col bounds, "
                 << this->m_chgLRhs << " row bounds"
                 << std::endl;)

   if(keepbounds)
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier kept "
                    << this->m_keptBnds << " column bounds, "
                    << this->m_keptLRhs << " row bounds"
                    << std::endl;)

      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Reduced LP has "
                    << lp.nRows() << " rows "
                    << lp.nCols() << " columns "
                    << lp.nNzos() << " nonzeros"
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout),
                    int numRangedRows = 0;
                    int numBoxedCols  = 0;
                    int numEqualities = 0;

                    for(int i = 0; i < lp.nRows(); ++i)
   {
      if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
         {
            if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
               ++numEqualities;
            else
               ++numRangedRows;
         }
      }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "Reduced LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         if(lp.nCols() == 0 && lp.nRows() == 0)
         {
            SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed all rows and columns" <<
                          std::endl;)
            m_result = this->VANISHED;
         }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "\nSimplifier performed:\n"
                 << m_stat[EMPTY_ROW]            << " empty rows\n"
                 << m_stat[FREE_ROW]             << " free rows\n"
                 << m_stat[SINGLETON_ROW]        << " singleton rows\n"
                 << m_stat[FORCE_ROW]            << " forcing rows\n"
                 << m_stat[EMPTY_COL]            << " empty columns\n"
                 << m_stat[FIX_COL]              << " fixed columns\n"
                 << m_stat[FREE_ZOBJ_COL]        << " free columns with zero objective\n"
                 << m_stat[ZOBJ_SINGLETON_COL]   << " singleton columns with zero objective\n"
                 << m_stat[DOUBLETON_ROW]        << " singleton columns combined with a doubleton equation\n"
                 << m_stat[FREE_SINGLETON_COL]   << " free singleton columns\n"
                 << m_stat[DOMINATED_COL]        << " dominated columns\n"
                 << m_stat[WEAKLY_DOMINATED_COL] << " weakly dominated columns\n"
                 << m_stat[DUPLICATE_ROW]        << " duplicate rows\n"
                 << m_stat[FIX_DUPLICATE_COL]    << " duplicate columns (fixed)\n"
                 << m_stat[SUB_DUPLICATE_COL]    << " duplicate columns (substituted)\n"
                 << m_stat[AGGREGATION]          << " variable aggregations\n"
                 << m_stat[MULTI_AGG]            << " multi aggregations\n"
                 << std::endl;);

   this->m_timeUsed->stop();

   return m_result;
}